

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError ChunkSetHead(WebPChunk *chunk,WebPChunk **chunk_list)

{
  undefined8 *puVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  WebPChunk *new_chunk;
  size_t in_stack_ffffffffffffffe0;
  WebPMuxError local_4;
  
  if (*in_RSI == 0) {
    puVar1 = (undefined8 *)WebPSafeMalloc((uint64_t)in_RSI,in_stack_ffffffffffffffe0);
    if (puVar1 == (undefined8 *)0x0) {
      local_4 = WEBP_MUX_MEMORY_ERROR;
    }
    else {
      *puVar1 = *in_RDI;
      puVar1[1] = in_RDI[1];
      puVar1[2] = in_RDI[2];
      puVar1[3] = in_RDI[3];
      *(undefined4 *)((long)in_RDI + 4) = 0;
      puVar1[3] = 0;
      *in_RSI = (long)puVar1;
      local_4 = WEBP_MUX_OK;
    }
  }
  else {
    local_4 = WEBP_MUX_NOT_FOUND;
  }
  return local_4;
}

Assistant:

WebPMuxError ChunkSetHead(WebPChunk* const chunk,
                          WebPChunk** const chunk_list) {
  WebPChunk* new_chunk;

  assert(chunk_list != NULL);
  if (*chunk_list != NULL) {
    return WEBP_MUX_NOT_FOUND;
  }

  new_chunk = (WebPChunk*)WebPSafeMalloc(1ULL, sizeof(*new_chunk));
  if (new_chunk == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_chunk = *chunk;
  chunk->owner = 0;
  new_chunk->next = NULL;
  *chunk_list = new_chunk;
  return WEBP_MUX_OK;
}